

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint32_t __thiscall Cache::getReplacementBlockId(Cache *this,uint32_t set_id)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  uint in_ESI;
  long in_RDI;
  int base;
  int res;
  int node;
  uint32_t i_1;
  uint32_t return_id;
  uint32_t min_reference;
  uint32_t i;
  uint32_t end;
  uint32_t begin;
  int local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_4;
  
  local_2c = in_ESI * *(int *)(in_RDI + 0x3c);
  uVar1 = local_2c + *(int *)(in_RDI + 0x3c);
  local_20 = local_2c;
  while( true ) {
    if (uVar1 <= local_20) {
      if (*(int *)(in_RDI + 0x44) == 0) {
        pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                           ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                            (ulong)local_2c);
        local_24 = pvVar3->last_reference;
        local_28 = local_2c;
        for (; local_2c < uVar1; local_2c = local_2c + 1) {
          pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                             ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18)
                              ,(ulong)local_2c);
          if (pvVar3->last_reference < local_24) {
            local_28 = local_2c;
            pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                               ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)
                                (in_RDI + 0x18),(ulong)local_2c);
            local_24 = pvVar3->last_reference;
          }
        }
        local_4 = local_28;
      }
      else if (*(int *)(in_RDI + 0x44) == 1) {
        uVar2 = rand();
        local_4 = local_2c + uVar2 % (uVar1 - local_2c);
      }
      else {
        local_34 = 0;
        local_38 = 1;
        for (local_30 = 1; local_30 < *(uint *)(in_RDI + 0x3c);
            local_30 = local_30 * 2 +
                       *(int *)(*(long *)(*(long *)(in_RDI + 0x48) + (ulong)in_ESI * 8) +
                               (long)(int)local_30 * 4)) {
          local_34 = local_38 *
                     *(int *)(*(long *)(*(long *)(in_RDI + 0x48) + (ulong)in_ESI * 8) +
                             (long)(int)local_30 * 4) + local_34;
          local_38 = local_38 << 1;
        }
        local_4 = local_34 + local_2c;
      }
      return local_4;
    }
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                        (ulong)local_20);
    if ((pvVar3->valid & 1U) == 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

uint32_t Cache::getReplacementBlockId(uint32_t set_id) {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    // 空的
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return i;
    }

    if (this->replace_policy == Cache::ReplacePolicy::LRU) {
        // LRU
        uint32_t min_reference = this->blocks[begin].last_reference;
        uint32_t return_id = begin;
        for (uint32_t i = begin; i < end; i++) {
            if (this->blocks[i].last_reference < min_reference) {
                return_id = i;
                min_reference = this->blocks[i].last_reference;
            }
        }
        return return_id;
    } else if (this->replace_policy == Cache::ReplacePolicy::RANDOM) {
        // RANDOM
        return begin + rand() % (end - begin);
    } else {
        //PLRU
        int node, res = 0, base;
        for (node = 1, base = 1; node < this->policy.associativity; base *= 2) {
            res += base * plru_bit[set_id][node];
            node = node * 2 + plru_bit[set_id][node];
        }
        return res + begin;
    }
}